

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastEvR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  MessageLite *pMVar3;
  uint64_t uVar4;
  uchar uVar5;
  byte bVar6;
  int8_t iVar7;
  bool bVar8;
  uint16_t uVar9;
  unsigned_short uVar10;
  uint uVar11;
  char *pcVar12;
  FieldAux *pFVar13;
  uint *puVar14;
  ulong uVar15;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint32_t *extraout_RDX;
  uint32_t *extraout_RDX_00;
  uint32_t *extraout_RDX_01;
  uint32_t *extraout_RDX_02;
  uint32_t *extraout_RDX_03;
  uint32_t *extraout_RDX_04;
  uint32_t *extraout_RDX_05;
  uint32_t *extraout_RDX_06;
  uint32_t *extraout_RDX_07;
  uint32_t *extraout_RDX_08;
  uint32_t *extraout_RDX_09;
  uint32_t *extraout_RDX_10;
  uint32_t *data_00;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_3c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_3b8;
  FieldAux local_3b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_3a8;
  ulong local_3a0;
  uint64_t tmp;
  char *ptr2;
  FieldAux local_388;
  FieldAux aux;
  RepeatedField<int> *pRStack_378;
  uchar expected_tag;
  RepeatedField<int> *field;
  uint64_t local_368;
  TcParseTableBase *local_360;
  ParseContext *local_358;
  char *local_350;
  MessageLite *local_348;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_340;
  TcFieldData local_338;
  TcFieldData local_330;
  undefined1 local_321;
  uint64_t uStack_320;
  bool always_return;
  TcParseTableBase *local_318;
  ParseContext *local_310;
  char *local_308;
  MessageLite *local_300;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2f8;
  ulong local_2f0;
  int64_t res;
  char *local_2e0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2d8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2d0;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  uint32_t has_bits_offset_1;
  int16_t lo;
  ulong local_188;
  int64_t res3;
  int64_t res2;
  anon_class_8_1_54a39810 last;
  anon_class_8_1_54a39810 next;
  bool kIs32BitVarint;
  bool kIs64BitVarint;
  char *local_158;
  char *local_150;
  int64_t *local_148;
  int8_t local_131;
  ulong *local_130;
  int8_t local_119;
  int64_t *local_118;
  int8_t local_101;
  ulong *local_100;
  int8_t local_e9;
  int8_t local_d9;
  int8_t local_c9;
  int8_t local_b9;
  int8_t local_a9;
  int64_t *local_a8;
  int8_t local_91;
  ulong *local_90;
  int8_t local_79;
  int64_t *local_78;
  int8_t local_61;
  ulong *local_60;
  int8_t local_49;
  int8_t local_39;
  int8_t local_29;
  int8_t local_19;
  int8_t local_9;
  
  local_368 = hasbits;
  local_360 = table;
  local_358 = ctx;
  local_350 = ptr;
  local_348 = msg;
  local_340 = data.field_0;
  uVar5 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_340);
  pMVar3 = local_348;
  pcVar12 = local_350;
  pPVar2 = local_358;
  if (uVar5 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&field);
    pcVar12 = MiniParse(pMVar3,pcVar12,pPVar2,(TcFieldData)field,local_360,local_368);
    return pcVar12;
  }
  uVar9 = TcFieldData::offset((TcFieldData *)&local_340);
  pRStack_378 = RefAt<google::protobuf::RepeatedField<int>>(pMVar3,(ulong)uVar9);
  aux.map_info.node_size_info._3_1_ = UnalignedLoad<unsigned_char>(local_350);
  pTVar1 = local_360;
  bVar6 = TcFieldData::aux_idx((TcFieldData *)&local_340);
  pFVar13 = TcParseTableBase::field_aux(pTVar1,(uint)bVar6);
  ptr2 = *(char **)pFVar13;
  local_388 = (FieldAux)ptr2;
  do {
    tmp = (uint64_t)local_350;
    local_350 = local_350 + 1;
    res = (int64_t)&local_3a0;
    last.p = &local_158;
    res2 = (int64_t)&local_158;
    local_2e0 = local_350;
    local_158 = local_350;
    iVar7 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
    local_2f0 = (ulong)iVar7;
    if (iVar7 < '\0') {
      local_131 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last)
      ;
      local_148 = &res3;
      res3 = (long)local_131 << 7 | local_2f0 >> 0x39;
      data_00 = extraout_RDX_00;
      local_d9 = local_131;
      if (res3 < 0) {
        local_119 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                              (&last);
        local_130 = &local_188;
        local_188 = (long)local_119 << 0xe | local_2f0 >> 0x32;
        data_00 = extraout_RDX_01;
        local_c9 = local_119;
        if ((long)local_188 < 0) {
          local_101 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                (&last);
          local_118 = &res3;
          res3 = ((long)local_101 << 0x15 | local_2f0 >> 0x2b) & res3;
          data_00 = extraout_RDX_02;
          local_b9 = local_101;
          if (res3 < 0) {
            local_e9 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                 (&last);
            local_100 = &local_188;
            local_188 = ((long)local_e9 << 0x1c | local_2f0 >> 0x24) & local_188;
            data_00 = extraout_RDX_03;
            local_a9 = local_e9;
            if ((long)local_188 < 0) {
              local_91 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                   (&last);
              local_a8 = &res3;
              res3 = ((long)local_91 << 0x23 | local_2f0 >> 0x1d) & res3;
              data_00 = extraout_RDX_04;
              local_39 = local_91;
              if (res3 < 0) {
                local_79 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                           operator()(&last);
                local_90 = &local_188;
                local_188 = ((long)local_79 << 0x2a | local_2f0 >> 0x16) & local_188;
                data_00 = extraout_RDX_05;
                local_29 = local_79;
                if ((long)local_188 < 0) {
                  local_61 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                             operator()(&last);
                  local_78 = &res3;
                  res3 = ((long)local_61 << 0x31 | local_2f0 >> 0xf) & res3;
                  data_00 = extraout_RDX_06;
                  local_19 = local_61;
                  if (res3 < 0) {
                    local_49 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                               operator()(&last);
                    local_60 = &local_188;
                    local_188 = ((long)local_49 << 0x38 | local_2f0 >> 8) & local_188;
                    data_00 = extraout_RDX_07;
                    local_9 = local_49;
                    if (((long)local_188 < 0) &&
                       (iVar7 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                operator()(&last), data_00 = extraout_RDX_08, iVar7 != '\x01')) {
                      iVar7 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                              operator()((anon_class_8_1_54a39810 *)&res2);
                      if (((int)iVar7 & 0x80U) != 0) {
                        local_150 = (char *)0x0;
                        data_00 = extraout_RDX_09;
                        goto LAB_0019b41c;
                      }
                      bVar6 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                              operator()((anon_class_8_1_54a39810 *)&res2);
                      data_00 = extraout_RDX_10;
                      if ((bVar6 & 1) == 0) {
                        local_188 = local_188 ^ 0x8000000000000000;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        res3 = local_188 & res3;
      }
      local_2f0 = res3 & local_2f0;
      if (local_158 == (char *)0x0) {
        protobuf_assumption_failed
                  ("p != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/varint_shuffle.h"
                   ,0x91);
      }
      local_150 = local_158;
    }
    else {
      local_150 = local_158;
      data_00 = extraout_RDX;
    }
LAB_0019b41c:
    local_2e0 = local_150;
    *(ulong *)res = local_2f0;
    pMVar3 = local_348;
    pPVar2 = local_358;
    local_350 = local_2e0;
    if (local_2e0 == (char *)0x0) {
      TcFieldData::TcFieldData((TcFieldData *)&local_3a8);
      pcVar12 = Error(pMVar3,(char *)0x0,pPVar2,(TcFieldData)local_3a8,local_360,local_368);
      return pcVar12;
    }
    local_3b0 = local_388;
    bVar8 = ValidateEnum((internal *)(local_3a0 & 0xffffffff),local_388.offset,data_00);
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      local_350 = (char *)tmp;
      local_3b8 = local_340;
      pcVar12 = FastUnknownEnumFallback
                          (local_348,(char *)tmp,local_358,(TcFieldData)local_340,local_360,
                           local_368);
      return pcVar12;
    }
    RepeatedField<int>::Add(pRStack_378,(int)local_3a0);
    bVar8 = EpsCopyInputStream::DataAvailable(&local_358->super_EpsCopyInputStream,local_350);
    pMVar3 = local_348;
    pcVar12 = local_350;
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_3c0);
      if (local_360->has_bits_offset != 0) {
        uVar11 = (uint)local_368;
        puVar14 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_360->has_bits_offset);
        *puVar14 = uVar11 | *puVar14;
      }
      return pcVar12;
    }
    uVar5 = UnalignedLoad<unsigned_char>(local_350);
    local_300 = local_348;
    local_308 = local_350;
    local_310 = local_358;
    if (uVar5 != aux.map_info.node_size_info._3_1_) {
      TcFieldData::TcFieldData(&data_local);
      local_2f8 = data_local.field_0;
      local_318 = local_360;
      uStack_320 = local_368;
      local_321 = 0;
      bVar8 = EpsCopyInputStream::DataAvailable(&local_310->super_EpsCopyInputStream,local_308);
      pMVar3 = local_300;
      pcVar12 = local_308;
      pPVar2 = local_310;
      if (!bVar8) {
        TcFieldData::TcFieldData(&local_330);
        if (local_318->has_bits_offset != 0) {
          uVar11 = (uint)uStack_320;
          puVar14 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_318->has_bits_offset);
          *puVar14 = uVar11 | *puVar14;
        }
        return pcVar12;
      }
      TcFieldData::TcFieldData(&local_338);
      pTVar1 = local_318;
      uVar4 = uStack_320;
      uVar10 = UnalignedLoad<unsigned_short>(pcVar12);
      uVar15 = (ulong)(int)((uint)uVar10 & (uint)pTVar1->fast_idx_mask);
      if ((uVar15 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           TcParseTableBase::fast_entry(pTVar1,uVar15 >> 3);
      local_2d0.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar10;
      UNRECOVERED_JUMPTABLE =
           TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_2d8.data = local_2d0.data;
      pcVar12 = (*UNRECOVERED_JUMPTABLE)(pMVar3,pcVar12,pPVar2,(TcFieldData)local_2d0,pTVar1,uVar4);
      return pcVar12;
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEvR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnum<uint8_t, field_layout::kTvEnum>(
      PROTOBUF_TC_PARAM_PASS);
}